

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O3

int Lpk_NodeCutsOneFilter(Lpk_Cut_t *pCuts,int nCuts,Lpk_Cut_t *pCutNew)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  ulong uVar4;
  Lpk_Cut_t *pLVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  if ((pCutNew->uSign[0] == 0) && (pCutNew->uSign[1] == 0)) {
    __assert_fail("pCutNew->uSign[0] || pCutNew->uSign[1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkCut.c"
                  ,0x16e,"int Lpk_NodeCutsOneFilter(Lpk_Cut_t *, int, Lpk_Cut_t *)");
  }
  if (0 < nCuts) {
    piVar3 = pCuts->pLeaves;
    uVar4 = 0;
    do {
      uVar1 = *(uint *)(pCuts + uVar4) & 0x3f;
      if (uVar1 != 0) {
        pLVar5 = pCuts + uVar4;
        uVar7 = *(uint *)pCutNew & 0x3f;
        if (uVar1 == uVar7) {
          if ((pLVar5->uSign[0] == pCutNew->uSign[0]) && (pLVar5->uSign[1] == pCutNew->uSign[1])) {
            uVar6 = 0;
            while (piVar3[uVar6] == pCutNew->pLeaves[uVar6]) {
              uVar6 = uVar6 + 1;
              if (uVar1 == uVar6) {
                return 1;
              }
            }
            if (uVar1 == (uint)uVar6) {
              return 1;
            }
          }
        }
        else {
          uVar2 = pCutNew->uSign[0] & pLVar5->uSign[0];
          if (uVar1 < uVar7) {
            if ((uVar2 == pLVar5->uSign[0]) && ((pLVar5->uSign[1] & ~pCutNew->uSign[1]) == 0)) {
              uVar6 = 0;
              do {
                uVar8 = 0;
                while (pLVar5->pLeaves[uVar6] != pCutNew->pLeaves[uVar8]) {
                  uVar8 = uVar8 + 1;
                  if (uVar7 == uVar8) goto LAB_004e58b5;
                }
                uVar6 = uVar6 + 1;
                if (uVar6 == uVar1) {
                  return 1;
                }
              } while( true );
            }
          }
          else if ((uVar2 == pCutNew->uSign[0]) && ((pCutNew->uSign[1] & ~pLVar5->uSign[1]) == 0)) {
            if (uVar7 != 0) {
              uVar6 = 0;
              do {
                uVar8 = 0;
                while (pCutNew->pLeaves[uVar6] != piVar3[uVar8]) {
                  uVar8 = uVar8 + 1;
                  if (uVar1 == uVar8) goto LAB_004e58b5;
                }
                uVar6 = uVar6 + 1;
              } while (uVar6 != uVar7);
            }
            *(uint *)pLVar5 = *(uint *)(pCuts + uVar4) & 0xffffffc0;
          }
        }
      }
LAB_004e58b5:
      uVar4 = uVar4 + 1;
      piVar3 = piVar3 + 0xcd;
    } while (uVar4 != (uint)nCuts);
  }
  return 0;
}

Assistant:

int Lpk_NodeCutsOneFilter( Lpk_Cut_t * pCuts, int nCuts, Lpk_Cut_t * pCutNew )
{
    Lpk_Cut_t * pCut;
    int i, k;
    assert( pCutNew->uSign[0] || pCutNew->uSign[1] );
    // try to find the cut
    for ( i = 0; i < nCuts; i++ )
    {
        pCut = pCuts + i;
        if ( pCut->nLeaves == 0 )
            continue;
        if ( pCut->nLeaves == pCutNew->nLeaves )
        {
            if ( pCut->uSign[0] == pCutNew->uSign[0] && pCut->uSign[1] == pCutNew->uSign[1] )
            {
                for ( k = 0; k < (int)pCutNew->nLeaves; k++ )
                    if ( pCut->pLeaves[k] != pCutNew->pLeaves[k] )
                        break;
                if ( k == (int)pCutNew->nLeaves )
                    return 1;
            }
            continue;
        }
        if ( pCut->nLeaves < pCutNew->nLeaves )
        {
            // skip the non-contained cuts
            if ( (pCut->uSign[0] & pCutNew->uSign[0]) != pCut->uSign[0] )
                continue;
            if ( (pCut->uSign[1] & pCutNew->uSign[1]) != pCut->uSign[1] )
                continue;
            // check containment seriously
            if ( Lpk_NodeCutsOneDominance( pCut, pCutNew ) )
                return 1;
            continue;
        }
        // check potential containment of other cut

        // skip the non-contained cuts
        if ( (pCut->uSign[0] & pCutNew->uSign[0]) != pCutNew->uSign[0] )
            continue;
        if ( (pCut->uSign[1] & pCutNew->uSign[1]) != pCutNew->uSign[1] )
            continue;
        // check containment seriously
        if ( Lpk_NodeCutsOneDominance( pCutNew, pCut ) )
            pCut->nLeaves = 0; // removed
    }
    return 0;
}